

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_VALUE_ASSIGN(State *state,Instruction *instr)

{
  size_type sVar1;
  reference v;
  undefined1 local_48 [32];
  undefined1 local_28 [8];
  Variable V;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  V.nb_ref = (uint *)instr;
  sVar1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&state->op_lifo);
  if (sVar1 != 0) {
    v = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                  (&state->op_lifo);
    Variable::Variable((Variable *)local_28,v);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::pop_back
              (&state->op_lifo);
    Memory::Create((Memory *)local_48,(Type *)state->memory);
    Variable::operator=((Variable *)(local_48 + 0x10),(Variable *)local_48);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&state->op_lifo,(value_type *)(local_48 + 0x10));
    Variable::~Variable((Variable *)(local_48 + 0x10));
    Variable::~Variable((Variable *)local_48);
    Variable::~Variable((Variable *)local_28);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_ASSIGN(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() == 0)
        return;
    Variable V = state.op_lifo.back();
    state.op_lifo.pop_back();
    state.op_lifo.push_back(state.memory.Create(Type::NIL) = V);
}